

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtScaledBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
cbtScaledTriangleCallback::processTriangle
          (cbtScaledTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  fVar1 = (this->m_localScaling).m_floats[0];
  fVar2 = (this->m_localScaling).m_floats[1];
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar1 * triangle->m_floats[0])),
                         ZEXT416((uint)(fVar2 * triangle->m_floats[1])),0x10);
  fVar3 = (this->m_localScaling).m_floats[2];
  local_38 = vinsertps_avx(auVar4,ZEXT416((uint)(fVar3 * triangle->m_floats[2])),0x28);
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar1 * triangle[1].m_floats[0])),
                         ZEXT416((uint)(fVar2 * triangle[1].m_floats[1])),0x10);
  local_28 = vinsertps_avx(auVar4,ZEXT416((uint)(fVar3 * triangle[1].m_floats[2])),0x28);
  auVar4 = vinsertps_avx(ZEXT416((uint)(fVar1 * triangle[2].m_floats[0])),
                         ZEXT416((uint)(fVar2 * triangle[2].m_floats[1])),0x10);
  local_18 = vinsertps_avx(auVar4,ZEXT416((uint)(fVar3 * triangle[2].m_floats[2])),0x28);
  (*this->m_originalCallback->_vptr_cbtTriangleCallback[2])(this->m_originalCallback,local_38);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		cbtVector3 newTriangle[3];
		newTriangle[0] = triangle[0] * m_localScaling;
		newTriangle[1] = triangle[1] * m_localScaling;
		newTriangle[2] = triangle[2] * m_localScaling;
		m_originalCallback->processTriangle(&newTriangle[0], partId, triangleIndex);
	}